

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

int doprinuse(void)

{
  boolean bVar1;
  obj **obj;
  uint uVar2;
  char lets [53];
  char local_58 [64];
  
  obj = &invent;
  uVar2 = 0;
LAB_001ab77a:
  obj = &((obj *)obj)->nobj->nobj;
  if ((obj *)obj == (obj *)0x0) {
    local_58[uVar2] = '\0';
    if (uVar2 == 0) {
      pline("You are not wearing or wielding anything.");
    }
    else {
      display_inventory(local_58,'\0');
    }
    return 0;
  }
  if ((((obj *)obj)->owornmask & 0x1f077fU) == 0) goto code_r0x001ab78e;
  goto LAB_001ab79a;
code_r0x001ab78e:
  bVar1 = tool_in_use((obj *)obj);
  if (bVar1 != '\0') {
LAB_001ab79a:
    local_58[uVar2] = ((obj *)obj)->invlet;
    uVar2 = uVar2 + 1;
  }
  goto LAB_001ab77a;
}

Assistant:

int doprinuse(void)
{
	struct obj *otmp;
	int ct = 0;
	char lets[52+1];

	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_worn(otmp) || tool_in_use(otmp))
		lets[ct++] = obj_to_let(otmp);
	lets[ct] = '\0';
	if (!ct) pline("You are not wearing or wielding anything.");
	else display_inventory(lets, FALSE);
	return 0;
}